

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Format.h
# Opt level: O0

uint __thiscall
llvm::format_object_base::print(format_object_base *this,char *Buffer,uint BufferSize)

{
  int N;
  uint BufferSize_local;
  char *Buffer_local;
  format_object_base *this_local;
  
  if (BufferSize != 0) {
    this_local._4_4_ = (*this->_vptr_format_object_base[1])(this,Buffer,(ulong)BufferSize);
    if ((int)this_local._4_4_ < 0) {
      this_local._4_4_ = BufferSize << 1;
    }
    else if (BufferSize <= this_local._4_4_) {
      this_local._4_4_ = this_local._4_4_ + 1;
    }
    return this_local._4_4_;
  }
  __assert_fail("BufferSize && \"Invalid buffer size!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/Format.h"
                ,0x37,"unsigned int llvm::format_object_base::print(char *, unsigned int) const");
}

Assistant:

unsigned print(char *Buffer, unsigned BufferSize) const {
    assert(BufferSize && "Invalid buffer size!");

    // Print the string, leaving room for the terminating null.
    int N = snprint(Buffer, BufferSize);

    // VC++ and old GlibC return negative on overflow, just double the size.
    if (N < 0)
      return BufferSize * 2;

    // Other implementations yield number of bytes needed, not including the
    // final '\0'.
    if (unsigned(N) >= BufferSize)
      return N + 1;

    // Otherwise N is the length of output (not including the final '\0').
    return N;
  }